

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  float *__src;
  float *__src_00;
  float *__dest;
  Mat *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  void *in_R8;
  float *ptr;
  float *pr;
  float *pf;
  int i;
  int ret1;
  Mat cell1;
  Mat hidden1;
  int ret0;
  Mat cell0;
  Mat hidden0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat *top_blob;
  Allocator *hidden_cell_allocator;
  Mat cell;
  Mat hidden;
  int num_directions;
  int T;
  Mat *bottom_blob;
  Mat *in_stack_fffffffffffff988;
  Mat *in_stack_fffffffffffff990;
  Mat *in_stack_fffffffffffff998;
  Mat *in_stack_fffffffffffff9a0;
  undefined8 in_stack_fffffffffffff9a8;
  Mat *in_stack_fffffffffffff9b0;
  Mat *in_stack_fffffffffffff9b8;
  int *local_600;
  int local_5d4;
  Mat local_4f0 [2];
  Mat *in_stack_fffffffffffffba0;
  Mat *in_stack_fffffffffffffba8;
  Mat *in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbbc;
  Mat *in_stack_fffffffffffffbc0;
  Mat *in_stack_fffffffffffffbc8;
  Mat *in_stack_fffffffffffffbe0;
  Mat *in_stack_fffffffffffffbe8;
  Option *in_stack_fffffffffffffbf0;
  Mat local_380 [2];
  Mat local_2f0;
  Mat local_2a8 [4];
  int local_184;
  reference local_180;
  int local_174;
  Mat local_170;
  Mat local_128;
  int *local_e0;
  Mat local_c8;
  Mat local_80;
  int local_38;
  int local_34;
  const_reference local_30;
  Mat *local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  iVar3 = local_30->h;
  local_38 = (*(int *)(in_RDI + 0xd8) == 2) + 1;
  local_34 = iVar3;
  ncnn::Mat::Mat(&local_80);
  ncnn::Mat::Mat(&local_c8);
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
  if (sVar4 == 3) {
    local_600 = local_28->refcount;
  }
  else {
    local_600 = (int *)local_28->elemsize;
  }
  local_e0 = local_600;
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
  if (sVar4 == 3) {
    pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
    ncnn::Mat::clone(&local_128,(__fn *)pvVar5,local_e0,iVar3,in_R8);
    ncnn::Mat::operator=(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    ncnn::Mat::~Mat((Mat *)0x51f27c);
    pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
    ncnn::Mat::clone(&local_170,(__fn *)pvVar5,local_e0,iVar3,in_R8);
    ncnn::Mat::operator=(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    ncnn::Mat::~Mat((Mat *)0x51f2cc);
  }
  else {
    ncnn::Mat::create(in_stack_fffffffffffff9b0,(int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                      (int)in_stack_fffffffffffff9a8,(size_t)in_stack_fffffffffffff9a0,
                      (Allocator *)in_stack_fffffffffffff998);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff990);
    if (bVar1) {
      local_4 = -100;
      local_174 = 1;
      goto LAB_0051fe0b;
    }
    ncnn::Mat::fill(in_stack_fffffffffffff9a0,(float)((ulong)in_stack_fffffffffffff998 >> 0x20));
    ncnn::Mat::create(in_stack_fffffffffffff9b0,(int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                      (int)in_stack_fffffffffffff9a8,(size_t)in_stack_fffffffffffff9a0,
                      (Allocator *)in_stack_fffffffffffff998);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff990);
    if (bVar1) {
      local_4 = -100;
      local_174 = 1;
      goto LAB_0051fe0b;
    }
    ncnn::Mat::fill(in_stack_fffffffffffff9a0,(float)((ulong)in_stack_fffffffffffff998 >> 0x20));
  }
  local_180 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  ncnn::Mat::create(in_stack_fffffffffffff9b0,(int)((ulong)in_stack_fffffffffffff9a8 >> 0x20),
                    (int)in_stack_fffffffffffff9a8,(size_t)in_stack_fffffffffffff9a0,
                    (Allocator *)in_stack_fffffffffffff998);
  iVar3 = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff990);
  if (bVar1) {
    local_4 = -100;
    local_174 = 1;
  }
  else {
    if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
      ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
      ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
      ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
      in_stack_fffffffffffff990 = &local_c8;
      in_stack_fffffffffffff988 = &local_80;
      in_stack_fffffffffffff998 = local_28;
      iVar2 = lstm(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,
                   in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                   in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbf0);
      ncnn::Mat::~Mat((Mat *)0x51f5e8);
      ncnn::Mat::~Mat((Mat *)0x51f5f5);
      ncnn::Mat::~Mat((Mat *)0x51f602);
      local_184 = iVar2;
      if (iVar2 != 0) {
        local_174 = 1;
        local_4 = iVar2;
        goto LAB_0051fe0b;
      }
    }
    if (*(int *)(in_RDI + 0xd8) == 2) {
      ncnn::Mat::Mat(in_stack_fffffffffffff9a0,(int)((ulong)in_stack_fffffffffffff998 >> 0x20),
                     (int)in_stack_fffffffffffff998,(size_t)in_stack_fffffffffffff990,
                     (Allocator *)in_stack_fffffffffffff988);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff990);
      if (bVar1) {
        local_4 = -100;
        local_174 = 1;
      }
      else {
        ncnn::Mat::Mat(in_stack_fffffffffffff9a0,(int)((ulong)in_stack_fffffffffffff998 >> 0x20),
                       (int)in_stack_fffffffffffff998,(size_t)in_stack_fffffffffffff990,
                       (Allocator *)in_stack_fffffffffffff988);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff990);
        if (bVar1) {
          local_4 = -100;
          local_174 = 1;
        }
        else {
          ncnn::Mat::row_range
                    (in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20),
                     (int)in_stack_fffffffffffff990);
          ncnn::Mat::row_range
                    (in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20),
                     (int)in_stack_fffffffffffff990);
          ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
          ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
          ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
          in_stack_fffffffffffff990 = local_380;
          in_stack_fffffffffffff998 = local_28;
          iVar2 = lstm(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc
                       ,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                       in_stack_fffffffffffffba0,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8
                       ,in_stack_fffffffffffffbf0);
          ncnn::Mat::~Mat((Mat *)0x51f8d6);
          ncnn::Mat::~Mat((Mat *)0x51f8e3);
          ncnn::Mat::~Mat((Mat *)0x51f8f0);
          if (iVar2 == 0) {
            ncnn::Mat::row_range
                      (in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20),
                       (int)in_stack_fffffffffffff990);
            ncnn::Mat::row_range
                      (in_stack_fffffffffffff998,(int)((ulong)in_stack_fffffffffffff990 >> 0x20),
                       (int)in_stack_fffffffffffff990);
            ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
            ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
            ncnn::Mat::channel(in_stack_fffffffffffff9b8,iVar3);
            in_stack_fffffffffffff990 = local_4f0;
            iVar3 = lstm(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                         in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb0,
                         in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                         in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8,
                         in_stack_fffffffffffffbf0);
            ncnn::Mat::~Mat((Mat *)0x51fadf);
            ncnn::Mat::~Mat((Mat *)0x51faec);
            ncnn::Mat::~Mat((Mat *)0x51faf9);
            in_stack_fffffffffffff998 = local_28;
            if (iVar3 == 0) {
              for (local_5d4 = 0; local_5d4 < local_34; local_5d4 = local_5d4 + 1) {
                __src = ncnn::Mat::row(local_2a8,local_5d4);
                __src_00 = ncnn::Mat::row(&local_2f0,local_5d4);
                __dest = ncnn::Mat::row(local_180,local_5d4);
                memcpy(__dest,__src,(long)*(int *)(in_RDI + 0xd0) << 2);
                memcpy(__dest + *(int *)(in_RDI + 0xd0),__src_00,(long)*(int *)(in_RDI + 0xd0) << 2)
                ;
              }
              local_174 = 0;
            }
            else {
              local_174 = 1;
              local_4 = iVar3;
            }
            ncnn::Mat::~Mat((Mat *)0x51fcf1);
            ncnn::Mat::~Mat((Mat *)0x51fcfe);
          }
          else {
            local_174 = 1;
            local_4 = iVar2;
          }
          ncnn::Mat::~Mat((Mat *)0x51fd0b);
          ncnn::Mat::~Mat((Mat *)0x51fd18);
        }
        ncnn::Mat::~Mat((Mat *)0x51fd25);
      }
      ncnn::Mat::~Mat((Mat *)0x51fd32);
      if (local_174 != 0) goto LAB_0051fe0b;
    }
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
    if (sVar4 == 3) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,1);
      ncnn::Mat::operator=(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,2);
      ncnn::Mat::operator=(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    }
    local_4 = 0;
    local_174 = 1;
  }
LAB_0051fe0b:
  ncnn::Mat::~Mat((Mat *)0x51fe18);
  ncnn::Mat::~Mat((Mat *)0x51fe25);
  return local_4;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}